

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ZSTD_compressionParameters *cParams_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  U32 *pUVar7;
  seqDef *psVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  BYTE *pStart;
  uint uVar12;
  uint uVar13;
  ulong *puVar14;
  ulong *puVar15;
  ulong *puVar16;
  int iVar17;
  ulong *puVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong uVar25;
  BYTE *pBVar26;
  ulong *puVar27;
  uint uVar28;
  ulong uVar29;
  U32 UVar30;
  uint uVar31;
  ulong *puVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  BYTE *pBVar36;
  BYTE *pInLoopLimit;
  ZSTD_compressionParameters *cParams;
  ulong local_e0;
  uint local_bc;
  ulong local_90;
  
  puVar14 = (ulong *)((long)src + srcSize);
  puVar27 = (ulong *)((long)src + (srcSize - 8));
  pBVar26 = (ms->window).base + (ms->window).dictLimit;
  uVar4 = rep[1];
  puVar19 = (ulong *)((ulong)((int)src == (int)pBVar26) + (long)src);
  uVar28 = (int)puVar19 - (int)pBVar26;
  local_bc = uVar4;
  if (uVar28 < uVar4) {
    local_bc = 0;
  }
  uVar5 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar29 = (ulong)uVar5;
  if (uVar28 < uVar5) {
    uVar29 = 0;
  }
  uVar12 = (uint)uVar29;
  if (puVar19 < puVar27) {
    puVar1 = (ulong *)((long)puVar14 - 7);
    puVar2 = (ulong *)((long)puVar14 - 3);
    puVar3 = (ulong *)((long)puVar14 - 1);
    cParams_00 = &ms->cParams;
    do {
      uVar12 = (uint)uVar29;
      lVar35 = -uVar29;
      if (uVar12 == 0) {
        uVar33 = 0;
      }
      else {
        uVar33 = 0;
        if (*(int *)(((long)puVar19 + 1) - uVar29) == *(int *)((long)puVar19 + 1)) {
          puVar22 = (ulong *)((long)puVar19 + 5);
          puVar15 = (ulong *)((long)puVar19 + lVar35 + 5);
          puVar32 = puVar22;
          if (puVar22 < puVar1) {
            uVar24 = *puVar22 ^ *puVar15;
            uVar33 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            uVar33 = uVar33 >> 3 & 0x1fffffff;
            if (*puVar15 == *puVar22) {
              puVar32 = (ulong *)((long)puVar19 + 0xd);
              puVar15 = (ulong *)((long)puVar19 + lVar35 + 0xd);
              do {
                if (puVar1 <= puVar32) goto LAB_0048d62c;
                uVar24 = *puVar15;
                uVar21 = *puVar32;
                uVar25 = uVar21 ^ uVar24;
                uVar33 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                  }
                }
                uVar33 = (long)puVar32 + ((uVar33 >> 3 & 0x1fffffff) - (long)puVar22);
                puVar32 = puVar32 + 1;
                puVar15 = puVar15 + 1;
              } while (uVar24 == uVar21);
            }
          }
          else {
LAB_0048d62c:
            if ((puVar32 < puVar2) && ((int)*puVar15 == (int)*puVar32)) {
              puVar32 = (ulong *)((long)puVar32 + 4);
              puVar15 = (ulong *)((long)puVar15 + 4);
            }
            if ((puVar32 < puVar3) && ((short)*puVar15 == (short)*puVar32)) {
              puVar32 = (ulong *)((long)puVar32 + 2);
              puVar15 = (ulong *)((long)puVar15 + 2);
            }
            if (puVar32 < puVar14) {
              puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar15 == (char)*puVar32));
            }
            uVar33 = (long)puVar32 - (long)puVar22;
          }
          uVar33 = uVar33 + 4;
        }
      }
      uVar13 = (ms->cParams).minMatch;
      iVar17 = (int)puVar19;
      if (uVar13 - 6 < 2) {
        pUVar7 = ms->chainTable;
        uVar31 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar36 = (ms->window).base;
        uVar13 = (ms->window).lowLimit;
        uVar34 = iVar17 - (int)pBVar36;
        uVar11 = uVar34 - uVar31;
        if (uVar34 < uVar31) {
          uVar11 = 0;
        }
        uVar6 = (ms->cParams).searchLog;
        uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar19,6);
        if (uVar10 <= uVar13) goto LAB_0048dbb4;
        iVar17 = 1 << ((byte)uVar6 & 0x1f);
        local_e0 = 999999999;
        uVar24 = 3;
        do {
          puVar22 = (ulong *)(pBVar36 + uVar10);
          if (*(char *)(uVar24 + (long)puVar22) == *(char *)((long)puVar19 + uVar24)) {
            puVar32 = puVar19;
            if (puVar19 < puVar1) {
              uVar25 = *puVar19 ^ *puVar22;
              uVar21 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
              if (*puVar22 == *puVar19) {
                do {
                  puVar32 = puVar32 + 1;
                  puVar22 = puVar22 + 1;
                  if (puVar1 <= puVar32) goto LAB_0048d7b1;
                  uVar25 = *puVar32 ^ *puVar22;
                  uVar21 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar21 = (long)puVar32 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar19);
                } while (*puVar22 == *puVar32);
              }
            }
            else {
LAB_0048d7b1:
              if ((puVar32 < puVar2) && ((int)*puVar22 == (int)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar32 < puVar3) && ((short)*puVar22 == (short)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar32 < puVar14) {
                puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar22 == (char)*puVar32));
              }
              uVar21 = (long)puVar32 - (long)puVar19;
            }
          }
          else {
            uVar21 = 0;
          }
          if ((uVar24 < uVar21) &&
             (local_e0 = (ulong)((uVar34 + 2) - uVar10), uVar24 = uVar21,
             (ulong *)((long)puVar19 + uVar21) == puVar14)) {
            bVar9 = false;
          }
          else {
            uVar21 = uVar24;
            if (uVar11 < uVar10) {
              uVar10 = pUVar7[uVar10 & uVar31 - 1];
              bVar9 = true;
            }
            else {
              bVar9 = false;
            }
          }
        } while (((bVar9) && (uVar13 < uVar10)) &&
                (iVar17 = iVar17 + -1, uVar24 = uVar21, iVar17 != 0));
      }
      else if (uVar13 == 5) {
        pUVar7 = ms->chainTable;
        uVar31 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar36 = (ms->window).base;
        uVar13 = (ms->window).lowLimit;
        uVar34 = iVar17 - (int)pBVar36;
        uVar11 = uVar34 - uVar31;
        if (uVar34 < uVar31) {
          uVar11 = 0;
        }
        uVar6 = (ms->cParams).searchLog;
        uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar19,5);
        if (uVar13 < uVar10) {
          iVar17 = 1 << ((byte)uVar6 & 0x1f);
          local_e0 = 999999999;
          uVar24 = 3;
          do {
            puVar22 = (ulong *)(pBVar36 + uVar10);
            if (*(char *)(uVar24 + (long)puVar22) == *(char *)((long)puVar19 + uVar24)) {
              puVar32 = puVar19;
              if (puVar19 < puVar1) {
                uVar25 = *puVar19 ^ *puVar22;
                uVar21 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                uVar21 = uVar21 >> 3 & 0x1fffffff;
                if (*puVar22 == *puVar19) {
                  do {
                    puVar32 = puVar32 + 1;
                    puVar22 = puVar22 + 1;
                    if (puVar1 <= puVar32) goto LAB_0048d96a;
                    uVar25 = *puVar32 ^ *puVar22;
                    uVar21 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar21 = (long)puVar32 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar19);
                  } while (*puVar22 == *puVar32);
                }
              }
              else {
LAB_0048d96a:
                if ((puVar32 < puVar2) && ((int)*puVar22 == (int)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar32 < puVar3) && ((short)*puVar22 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar32 < puVar14) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar22 == (char)*puVar32));
                }
                uVar21 = (long)puVar32 - (long)puVar19;
              }
            }
            else {
              uVar21 = 0;
            }
            if ((uVar24 < uVar21) &&
               (local_e0 = (ulong)((uVar34 + 2) - uVar10), uVar24 = uVar21,
               (ulong *)((long)puVar19 + uVar21) == puVar14)) {
              bVar9 = false;
            }
            else {
              uVar21 = uVar24;
              if (uVar11 < uVar10) {
                uVar10 = pUVar7[uVar10 & uVar31 - 1];
                bVar9 = true;
              }
              else {
                bVar9 = false;
              }
            }
          } while (((bVar9) && (uVar13 < uVar10)) &&
                  (iVar17 = iVar17 + -1, uVar24 = uVar21, iVar17 != 0));
        }
        else {
LAB_0048dbb4:
          uVar21 = 3;
          local_e0 = 999999999;
        }
      }
      else {
        pUVar7 = ms->chainTable;
        uVar31 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar36 = (ms->window).base;
        uVar13 = (ms->window).lowLimit;
        uVar34 = iVar17 - (int)pBVar36;
        uVar11 = uVar34 - uVar31;
        if (uVar34 < uVar31) {
          uVar11 = 0;
        }
        uVar6 = (ms->cParams).searchLog;
        uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar19,4);
        if (uVar10 <= uVar13) goto LAB_0048dbb4;
        iVar17 = 1 << ((byte)uVar6 & 0x1f);
        local_e0 = 999999999;
        uVar24 = 3;
        do {
          puVar22 = (ulong *)(pBVar36 + uVar10);
          if (*(char *)(uVar24 + (long)puVar22) == *(char *)((long)puVar19 + uVar24)) {
            puVar32 = puVar19;
            if (puVar19 < puVar1) {
              uVar25 = *puVar19 ^ *puVar22;
              uVar21 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
              if (*puVar22 == *puVar19) {
                do {
                  puVar32 = puVar32 + 1;
                  puVar22 = puVar22 + 1;
                  if (puVar1 <= puVar32) goto LAB_0048db1a;
                  uVar25 = *puVar32 ^ *puVar22;
                  uVar21 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar21 = (long)puVar32 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar19);
                } while (*puVar22 == *puVar32);
              }
            }
            else {
LAB_0048db1a:
              if ((puVar32 < puVar2) && ((int)*puVar22 == (int)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar32 < puVar3) && ((short)*puVar22 == (short)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar32 < puVar14) {
                puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar22 == (char)*puVar32));
              }
              uVar21 = (long)puVar32 - (long)puVar19;
            }
          }
          else {
            uVar21 = 0;
          }
          if ((uVar24 < uVar21) &&
             (local_e0 = (ulong)((uVar34 + 2) - uVar10), uVar24 = uVar21,
             (ulong *)((long)puVar19 + uVar21) == puVar14)) {
            bVar9 = false;
          }
          else {
            uVar21 = uVar24;
            if (uVar11 < uVar10) {
              uVar10 = pUVar7[uVar10 & uVar31 - 1];
              bVar9 = true;
            }
            else {
              bVar9 = false;
            }
          }
        } while (((bVar9) && (uVar13 < uVar10)) &&
                (iVar17 = iVar17 + -1, uVar24 = uVar21, iVar17 != 0));
      }
      local_90 = uVar33;
      if (uVar33 < uVar21) {
        local_90 = uVar21;
      }
      if (local_90 < 4) {
        puVar19 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)src >> 8) + 1);
      }
      else {
        puVar22 = puVar19;
        if (uVar21 <= uVar33) {
          local_e0 = 0;
          puVar22 = (ulong *)((long)puVar19 + 1);
        }
        puVar32 = (ulong *)((long)puVar19 + lVar35 + 0xd);
        do {
          if (puVar27 <= puVar19) break;
          puVar15 = (ulong *)((long)puVar19 + 1);
          if (((local_e0 != 0) && (uVar12 != 0)) &&
             (*(int *)puVar15 == *(int *)((long)puVar15 + lVar35))) {
            puVar23 = (ulong *)((long)puVar19 + 5);
            puVar18 = (ulong *)((long)puVar19 + lVar35 + 5);
            puVar16 = puVar23;
            if (puVar23 < puVar1) {
              uVar24 = *puVar23 ^ *puVar18;
              uVar33 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar33 = uVar33 >> 3 & 0x1fffffff;
              if (*puVar18 == *puVar23) {
                puVar16 = (ulong *)((long)puVar19 + 0xd);
                puVar18 = puVar32;
                do {
                  if (puVar1 <= puVar16) goto LAB_0048dd01;
                  uVar24 = *puVar18;
                  uVar21 = *puVar16;
                  uVar25 = uVar21 ^ uVar24;
                  uVar33 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                    }
                  }
                  uVar33 = (long)puVar16 + ((uVar33 >> 3 & 0x1fffffff) - (long)puVar23);
                  puVar16 = puVar16 + 1;
                  puVar18 = puVar18 + 1;
                } while (uVar24 == uVar21);
              }
            }
            else {
LAB_0048dd01:
              if ((puVar16 < puVar2) && ((int)*puVar18 == (int)*puVar16)) {
                puVar16 = (ulong *)((long)puVar16 + 4);
                puVar18 = (ulong *)((long)puVar18 + 4);
              }
              if ((puVar16 < puVar3) && ((short)*puVar18 == (short)*puVar16)) {
                puVar16 = (ulong *)((long)puVar16 + 2);
                puVar18 = (ulong *)((long)puVar18 + 2);
              }
              if (puVar16 < puVar14) {
                puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar18 == (char)*puVar16));
              }
              uVar33 = (long)puVar16 - (long)puVar23;
            }
            if (uVar33 < 0xfffffffffffffffc) {
              uVar11 = (int)local_e0 + 1;
              uVar13 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              if ((int)((uVar13 ^ 0x1f) + (int)local_90 * 3 + -0x1e) < (int)(uVar33 + 4) * 3) {
                local_e0 = 0;
                puVar22 = puVar15;
                local_90 = uVar33 + 4;
              }
            }
          }
          uVar13 = (ms->cParams).minMatch;
          iVar17 = (int)puVar15;
          if (uVar13 - 6 < 2) {
            pUVar7 = ms->chainTable;
            uVar31 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar36 = (ms->window).base;
            uVar13 = (ms->window).lowLimit;
            uVar34 = iVar17 - (int)pBVar36;
            uVar11 = uVar34 - uVar31;
            if (uVar34 < uVar31) {
              uVar11 = 0;
            }
            uVar6 = (ms->cParams).searchLog;
            uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar15,6);
            if (uVar10 <= uVar13) goto LAB_0048e282;
            iVar17 = 1 << ((byte)uVar6 & 0x1f);
            uVar24 = 999999999;
            uVar33 = 3;
            do {
              puVar23 = (ulong *)(pBVar36 + uVar10);
              if (*(char *)(uVar33 + (long)puVar23) == *(char *)((long)puVar15 + uVar33)) {
                puVar16 = puVar15;
                if (puVar15 < puVar1) {
                  uVar25 = *puVar15 ^ *puVar23;
                  uVar21 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar21 = uVar21 >> 3 & 0x1fffffff;
                  puVar16 = (ulong *)((long)puVar19 + 9);
                  if (*puVar23 == *puVar15) {
                    do {
                      puVar23 = puVar23 + 1;
                      if (puVar1 <= puVar16) goto LAB_0048de9b;
                      uVar25 = *puVar16;
                      uVar20 = uVar25 ^ *puVar23;
                      uVar21 = 0;
                      if (uVar20 != 0) {
                        for (; (uVar20 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                        }
                      }
                      uVar21 = (long)puVar16 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar15);
                      puVar16 = puVar16 + 1;
                    } while (*puVar23 == uVar25);
                  }
                }
                else {
LAB_0048de9b:
                  if ((puVar16 < puVar2) && ((int)*puVar23 == (int)*puVar16)) {
                    puVar16 = (ulong *)((long)puVar16 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar16 < puVar3) && ((short)*puVar23 == (short)*puVar16)) {
                    puVar16 = (ulong *)((long)puVar16 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar16 < puVar14) {
                    puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar23 == (char)*puVar16));
                  }
                  uVar21 = (long)puVar16 - (long)puVar15;
                }
              }
              else {
                uVar21 = 0;
              }
              if ((uVar33 < uVar21) &&
                 (uVar24 = (ulong)((uVar34 + 2) - uVar10), uVar33 = uVar21,
                 (ulong *)((long)puVar15 + uVar21) == puVar14)) {
                bVar9 = false;
              }
              else {
                uVar21 = uVar33;
                if (uVar11 < uVar10) {
                  uVar10 = pUVar7[uVar10 & uVar31 - 1];
                  bVar9 = true;
                }
                else {
                  bVar9 = false;
                }
              }
            } while (((bVar9) && (uVar13 < uVar10)) &&
                    (iVar17 = iVar17 + -1, uVar33 = uVar21, iVar17 != 0));
          }
          else if (uVar13 == 5) {
            pUVar7 = ms->chainTable;
            uVar31 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar36 = (ms->window).base;
            uVar13 = (ms->window).lowLimit;
            uVar34 = iVar17 - (int)pBVar36;
            uVar11 = uVar34 - uVar31;
            if (uVar34 < uVar31) {
              uVar11 = 0;
            }
            uVar6 = (ms->cParams).searchLog;
            uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar15,5);
            if (uVar13 < uVar10) {
              iVar17 = 1 << ((byte)uVar6 & 0x1f);
              uVar24 = 999999999;
              uVar33 = 3;
              do {
                puVar23 = (ulong *)(pBVar36 + uVar10);
                if (*(char *)(uVar33 + (long)puVar23) == *(char *)((long)puVar15 + uVar33)) {
                  puVar16 = puVar15;
                  if (puVar15 < puVar1) {
                    uVar25 = *puVar15 ^ *puVar23;
                    uVar21 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar21 = uVar21 >> 3 & 0x1fffffff;
                    puVar16 = (ulong *)((long)puVar19 + 9);
                    if (*puVar23 == *puVar15) {
                      do {
                        puVar23 = puVar23 + 1;
                        if (puVar1 <= puVar16) goto LAB_0048e047;
                        uVar25 = *puVar16;
                        uVar20 = uVar25 ^ *puVar23;
                        uVar21 = 0;
                        if (uVar20 != 0) {
                          for (; (uVar20 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                          }
                        }
                        uVar21 = (long)puVar16 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar15);
                        puVar16 = puVar16 + 1;
                      } while (*puVar23 == uVar25);
                    }
                  }
                  else {
LAB_0048e047:
                    if ((puVar16 < puVar2) && ((int)*puVar23 == (int)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 4);
                      puVar23 = (ulong *)((long)puVar23 + 4);
                    }
                    if ((puVar16 < puVar3) && ((short)*puVar23 == (short)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 2);
                      puVar23 = (ulong *)((long)puVar23 + 2);
                    }
                    if (puVar16 < puVar14) {
                      puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar23 == (char)*puVar16))
                      ;
                    }
                    uVar21 = (long)puVar16 - (long)puVar15;
                  }
                }
                else {
                  uVar21 = 0;
                }
                if ((uVar33 < uVar21) &&
                   (uVar24 = (ulong)((uVar34 + 2) - uVar10), uVar33 = uVar21,
                   (ulong *)((long)puVar15 + uVar21) == puVar14)) {
                  bVar9 = false;
                }
                else {
                  uVar21 = uVar33;
                  if (uVar11 < uVar10) {
                    uVar10 = pUVar7[uVar10 & uVar31 - 1];
                    bVar9 = true;
                  }
                  else {
                    bVar9 = false;
                  }
                }
              } while (((bVar9) && (uVar13 < uVar10)) &&
                      (iVar17 = iVar17 + -1, uVar33 = uVar21, iVar17 != 0));
            }
            else {
LAB_0048e282:
              uVar21 = 3;
              uVar24 = 999999999;
            }
          }
          else {
            pUVar7 = ms->chainTable;
            uVar31 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar36 = (ms->window).base;
            uVar13 = (ms->window).lowLimit;
            uVar34 = iVar17 - (int)pBVar36;
            uVar11 = uVar34 - uVar31;
            if (uVar34 < uVar31) {
              uVar11 = 0;
            }
            uVar6 = (ms->cParams).searchLog;
            uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar15,4);
            if (uVar10 <= uVar13) goto LAB_0048e282;
            iVar17 = 1 << ((byte)uVar6 & 0x1f);
            uVar24 = 999999999;
            uVar33 = 3;
            do {
              puVar23 = (ulong *)(pBVar36 + uVar10);
              if (*(char *)(uVar33 + (long)puVar23) == *(char *)((long)puVar15 + uVar33)) {
                puVar16 = puVar15;
                if (puVar15 < puVar1) {
                  uVar25 = *puVar15 ^ *puVar23;
                  uVar21 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar21 = uVar21 >> 3 & 0x1fffffff;
                  puVar16 = (ulong *)((long)puVar19 + 9);
                  if (*puVar23 == *puVar15) {
                    do {
                      puVar23 = puVar23 + 1;
                      if (puVar1 <= puVar16) goto LAB_0048e1ea;
                      uVar25 = *puVar16;
                      uVar20 = uVar25 ^ *puVar23;
                      uVar21 = 0;
                      if (uVar20 != 0) {
                        for (; (uVar20 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                        }
                      }
                      uVar21 = (long)puVar16 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar15);
                      puVar16 = puVar16 + 1;
                    } while (*puVar23 == uVar25);
                  }
                }
                else {
LAB_0048e1ea:
                  if ((puVar16 < puVar2) && ((int)*puVar23 == (int)*puVar16)) {
                    puVar16 = (ulong *)((long)puVar16 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar16 < puVar3) && ((short)*puVar23 == (short)*puVar16)) {
                    puVar16 = (ulong *)((long)puVar16 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar16 < puVar14) {
                    puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar23 == (char)*puVar16));
                  }
                  uVar21 = (long)puVar16 - (long)puVar15;
                }
              }
              else {
                uVar21 = 0;
              }
              if ((uVar33 < uVar21) &&
                 (uVar24 = (ulong)((uVar34 + 2) - uVar10), uVar33 = uVar21,
                 (ulong *)((long)puVar15 + uVar21) == puVar14)) {
                bVar9 = false;
              }
              else {
                uVar21 = uVar33;
                if (uVar11 < uVar10) {
                  uVar10 = pUVar7[uVar10 & uVar31 - 1];
                  bVar9 = true;
                }
                else {
                  bVar9 = false;
                }
              }
            } while (((bVar9) && (uVar13 < uVar10)) &&
                    (iVar17 = iVar17 + -1, uVar33 = uVar21, iVar17 != 0));
          }
          bVar9 = true;
          if (3 < uVar21) {
            uVar11 = (int)local_e0 + 1;
            uVar13 = 0x1f;
            if (uVar11 != 0) {
              for (; uVar11 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            uVar11 = (int)uVar24 + 1;
            iVar17 = 0x1f;
            if (uVar11 != 0) {
              for (; uVar11 >> iVar17 == 0; iVar17 = iVar17 + -1) {
              }
            }
            if ((int)((uVar13 ^ 0x1f) + (int)local_90 * 4 + -0x1b) < (int)uVar21 * 4 - iVar17) {
              bVar9 = false;
              local_e0 = uVar24;
              puVar22 = puVar15;
              local_90 = uVar21;
            }
          }
          puVar32 = (ulong *)((long)puVar32 + 1);
          puVar19 = puVar15;
        } while (!bVar9);
        if (local_e0 == 0) {
          UVar30 = 1;
        }
        else {
          if ((src < puVar22) && (pBVar26 < (BYTE *)((long)puVar22 + (2 - local_e0)))) {
            puVar19 = puVar22;
            while (puVar22 = puVar19,
                  *(char *)((long)puVar19 - 1) == *(char *)((long)puVar19 + (1 - local_e0))) {
              puVar22 = (ulong *)((long)puVar19 - 1);
              local_90 = local_90 + 1;
              if ((puVar22 <= src) ||
                 (pBVar36 = (BYTE *)((long)puVar19 + (1 - local_e0)), puVar19 = puVar22,
                 pBVar36 <= pBVar26)) break;
            }
          }
          uVar29 = (ulong)((int)local_e0 - 2);
          UVar30 = (int)local_e0 + 1;
          local_bc = uVar12;
        }
        uVar33 = (long)puVar22 - (long)src;
        puVar32 = (ulong *)seqStore->lit;
        puVar19 = (ulong *)((long)puVar32 + uVar33);
        do {
          *puVar32 = *src;
          puVar32 = puVar32 + 1;
          src = (void *)((long)src + 8);
        } while (puVar32 < puVar19);
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar8 = seqStore->sequences;
        psVar8->litLength = (U16)uVar33;
        psVar8->offset = UVar30;
        if (0xffff < local_90 - 3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar8->matchLength = (U16)(local_90 - 3);
        seqStore->sequences = psVar8 + 1;
        src = (void *)((long)puVar22 + local_90);
        puVar19 = (ulong *)src;
        if ((local_bc != 0) && (src <= puVar27)) {
          while( true ) {
            uVar33 = (ulong)local_bc;
            uVar12 = (uint)uVar29;
            puVar19 = (ulong *)src;
            if ((int)*src != *(int *)((long)src - uVar33)) break;
            puVar19 = (ulong *)((long)src + 4);
            puVar32 = (ulong *)((long)src + (4 - uVar33));
            puVar22 = puVar19;
            if (puVar19 < puVar1) {
              uVar24 = *puVar19 ^ *puVar32;
              uVar29 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
              if (*puVar32 == *puVar19) {
                puVar22 = (ulong *)((long)src + 0xc);
                puVar32 = (ulong *)((long)src + (0xc - uVar33));
                do {
                  if (puVar1 <= puVar22) goto LAB_0048e4d6;
                  uVar24 = *puVar32;
                  uVar21 = *puVar22;
                  uVar25 = uVar21 ^ uVar24;
                  uVar29 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  uVar29 = (long)puVar22 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar19);
                  puVar22 = puVar22 + 1;
                  puVar32 = puVar32 + 1;
                } while (uVar24 == uVar21);
              }
            }
            else {
LAB_0048e4d6:
              if ((puVar22 < puVar2) && ((int)*puVar32 == (int)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 4);
                puVar32 = (ulong *)((long)puVar32 + 4);
              }
              if ((puVar22 < puVar3) && ((short)*puVar32 == (short)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 2);
                puVar32 = (ulong *)((long)puVar32 + 2);
              }
              if (puVar22 < puVar14) {
                puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar32 == (char)*puVar22));
              }
              uVar29 = (long)puVar22 - (long)puVar19;
            }
            *(ulong *)seqStore->lit = *src;
            psVar8 = seqStore->sequences;
            psVar8->litLength = 0;
            psVar8->offset = 1;
            if (0xffff < uVar29 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar8->matchLength = (U16)(uVar29 + 1);
            seqStore->sequences = psVar8 + 1;
            src = (void *)((long)src + uVar29 + 4);
            uVar29 = uVar33;
            puVar19 = (ulong *)src;
            local_bc = uVar12;
            if ((uVar12 == 0) || (puVar27 < src)) break;
          }
        }
      }
      uVar12 = (uint)uVar29;
    } while (puVar19 < puVar27);
  }
  uVar13 = 0;
  if (uVar28 < uVar4) {
    uVar13 = uVar4;
  }
  if (uVar28 < uVar5) {
    uVar13 = uVar5;
  }
  if (uVar12 == 0) {
    uVar12 = uVar13;
  }
  if (local_bc != 0) {
    uVar13 = local_bc;
  }
  *rep = uVar12;
  rep[1] = uVar13;
  return (long)puVar14 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 1, ZSTD_noDict);
}